

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

void Llb_Nonlin4SetupVarMap(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder)

{
  int iVar1;
  DdNode **x;
  DdNode **y;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar2;
  long lVar3;
  
  iVar1 = Cudd_ReadSize(dd);
  x = (DdNode **)malloc((long)iVar1 << 3);
  iVar1 = Cudd_ReadSize(dd);
  y = (DdNode **)malloc((long)iVar1 << 3);
  lVar3 = 0;
  while( true ) {
    if (pAig->nRegs <= lVar3) {
      Cudd_SetVarMap(dd,x,y,pAig->nRegs);
      free(x);
      free(y);
      return;
    }
    pObj = Saig_ManLi(pAig,(int)lVar3);
    pObj_00 = Saig_ManLo(pAig,(int)lVar3);
    iVar1 = Llb_ObjBddVar(vOrder,pObj);
    if (iVar1 < 0) break;
    iVar1 = Llb_ObjBddVar(vOrder,pObj_00);
    if (iVar1 < 0) {
      __assert_fail("Llb_ObjBddVar(vOrder, pObjLi) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                    ,0x1ab,"void Llb_Nonlin4SetupVarMap(DdManager *, Aig_Man_t *, Vec_Int_t *)");
    }
    iVar1 = Llb_ObjBddVar(vOrder,pObj);
    pDVar2 = Cudd_bddIthVar(dd,iVar1);
    x[lVar3] = pDVar2;
    iVar1 = Llb_ObjBddVar(vOrder,pObj_00);
    pDVar2 = Cudd_bddIthVar(dd,iVar1);
    y[lVar3] = pDVar2;
    lVar3 = lVar3 + 1;
  }
  __assert_fail("Llb_ObjBddVar(vOrder, pObjLo) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                ,0x1aa,"void Llb_Nonlin4SetupVarMap(DdManager *, Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

void Llb_Nonlin4SetupVarMap( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder )
{
    DdNode ** pVarsX, ** pVarsY;
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    pVarsX = ABC_ALLOC( DdNode *, Cudd_ReadSize(dd) );
    pVarsY = ABC_ALLOC( DdNode *, Cudd_ReadSize(dd) );
    Saig_ManForEachLiLo( pAig, pObjLo, pObjLi, i )
    {
        assert( Llb_ObjBddVar(vOrder, pObjLo) >= 0 );
        assert( Llb_ObjBddVar(vOrder, pObjLi) >= 0 );
        pVarsX[i] = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObjLo) );
        pVarsY[i] = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObjLi) );
    }
    Cudd_SetVarMap( dd, pVarsX, pVarsY, Aig_ManRegNum(pAig) );
    ABC_FREE( pVarsX );
    ABC_FREE( pVarsY );
}